

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int warn_is_equal_type(lys_type *type1,lys_type *type2)

{
  lys_type *local_30;
  lys_type *t2;
  lys_type *t1;
  lys_type *type2_local;
  lys_type *type1_local;
  
  t2 = (lys_type *)0x0;
  do {
    t2 = warn_is_equal_type_next_type(type1,t2);
    if (t2 == (lys_type *)0x0) {
      return 0;
    }
    if (t2->base == LY_TYPE_LEAFREF) {
      return 1;
    }
    local_30 = (lys_type *)0x0;
    while (local_30 = warn_is_equal_type_next_type(type2,local_30), local_30 != (lys_type *)0x0) {
      if (local_30->base == LY_TYPE_LEAFREF) {
        return 1;
      }
      if (local_30->base == t2->base) {
        return 1;
      }
    }
  } while( true );
}

Assistant:

static int
warn_is_equal_type(struct lys_type *type1, struct lys_type *type2)
{
    struct lys_type *t1, *t2;

    t1 = NULL;
    while ((t1 = warn_is_equal_type_next_type(type1, t1))) {
        if (t1->base == LY_TYPE_LEAFREF) {
            /* we do not check unions with leafrefs, that is just too much... */
            return 1;
        }

        t2 = NULL;
        while ((t2 = warn_is_equal_type_next_type(type2, t2))) {
            if (t2->base == LY_TYPE_LEAFREF) {
                return 1;
            }

            if (t2->base == t1->base) {
                /* match found */
                return 1;
            }
        }
    }

    return 0;
}